

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Complex.cpp
# Opt level: O2

void __thiscall Complex::buyOption(Complex *this,AsianGeometricPut *option,double *multiplier)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  value_type local_38;
  double local_10;
  
  local_38.super_PathDependentOption.super_Option.multiplier =
       (option->super_PathDependentOption).super_Option.multiplier;
  local_38.super_PathDependentOption.super_Option.K =
       (option->super_PathDependentOption).super_Option.K;
  local_38.super_PathDependentOption.super_Option.T =
       (option->super_PathDependentOption).super_Option.T;
  local_38.super_PathDependentOption.pathDependent =
       (option->super_PathDependentOption).pathDependent;
  local_38.super_PathDependentOption.super_Option._vptr_Option = (_func_int **)&PTR_print_00115c78;
  dVar1 = *multiplier;
  local_10 = Option::getMultiplier((Option *)&local_38);
  local_10 = dVar1 * local_10;
  Option::setMultiplier((Option *)&local_38,&local_10);
  std::vector<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>::push_back
            (&this->asian_geometric_put,&local_38);
  dVar2 = Option::getMaturity((Option *)&local_38);
  uVar3 = SUB84(dVar2,0);
  uVar4 = (undefined4)((ulong)dVar2 >> 0x20);
  dVar1 = this->max_T;
  if (dVar2 <= dVar1) {
    uVar3 = SUB84(dVar1,0);
    uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  this->max_T = (double)CONCAT44(uVar4,uVar3);
  AsianGeometricPut::~AsianGeometricPut(&local_38);
  return;
}

Assistant:

void Complex::buyOption(AsianGeometricPut const& option, double const& multiplier)
{
	AsianGeometricPut new_option = AsianGeometricPut(option);
	new_option.setMultiplier(multiplier * new_option.getMultiplier());
	asian_geometric_put.push_back(new_option);
	max_T = std::max(max_T, new_option.getMaturity());
}